

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O2

base_learner * cs_active_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<int> *ptVar4;
  typed_option<float> *ptVar5;
  typed_option<unsigned_long> *ptVar6;
  ostream *poVar7;
  base_learner *pbVar8;
  learner<char,_example> *base;
  learner<cs_active,_example> *plVar9;
  vw_exception *pvVar10;
  long lVar11;
  code *predict;
  code *learn;
  uint32_t i;
  uint uVar12;
  undefined **ppuVar13;
  label_parser *plVar14;
  byte bVar15;
  bool simulation;
  free_ptr<cs_active> data;
  allocator local_12a2;
  allocator local_12a1;
  allocator local_12a0;
  allocator local_129f;
  allocator local_129e;
  allocator local_129d;
  allocator local_129c;
  allocator local_129b;
  allocator local_129a;
  allocator local_1299;
  allocator local_1298;
  allocator local_1297;
  allocator local_1296;
  allocator local_1295;
  allocator local_1294;
  allocator local_1293;
  allocator local_1292;
  allocator local_1291;
  allocator local_1290;
  allocator local_128f;
  allocator local_128e;
  allocator local_128d;
  int domination;
  stringstream __msg;
  undefined1 local_1278 [96];
  bool local_1218;
  string local_1100 [32];
  string local_10e0;
  string local_10c0 [32];
  string local_10a0;
  string local_1080 [32];
  string local_1060;
  string local_1040 [32];
  string local_1020;
  string local_1000 [32];
  string local_fe0;
  string local_fc0 [32];
  string local_fa0;
  string local_f80 [32];
  string local_f60;
  string local_f40 [32];
  string local_f20;
  string local_f00 [32];
  string local_ee0;
  string local_ec0 [32];
  string local_ea0;
  string local_e80 [32];
  string local_e60;
  string local_e40;
  string local_e20;
  string local_e00;
  string local_de0;
  string local_dc0;
  string local_da0;
  option_group_definition new_options;
  string loss_function_type;
  string local_d18 [112];
  undefined1 local_ca8 [160];
  undefined1 local_c08 [160];
  typed_option<bool> local_b68;
  typed_option<float> local_ac8;
  typed_option<float> local_a28;
  typed_option<float> local_988;
  typed_option<float> local_8e8;
  typed_option<unsigned_long> local_848;
  typed_option<unsigned_long> local_7a8;
  typed_option<unsigned_long> local_708;
  typed_option<unsigned_long> local_668;
  typed_option<float> local_5c8;
  typed_option<float> local_528;
  typed_option<float> local_488;
  typed_option<float> local_3e8;
  typed_option<int> local_348;
  typed_option<int> local_2a8;
  typed_option<bool> local_208;
  typed_option<bool> local_168;
  typed_option<unsigned_int> local_c8;
  
  bVar15 = 0;
  scoped_calloc_or_throw<cs_active>();
  simulation = false;
  std::__cxx11::string::string
            ((string *)&local_e40,"Cost-sensitive Active Learning",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_e40);
  std::__cxx11::string::~string((string *)&local_e40);
  std::__cxx11::string::string((string *)&local_e60,"cs_active",&local_128d);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_e60,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->num_classes);
  local_1218 = true;
  std::__cxx11::string::string
            (local_e80,"Cost-sensitive active learning with <k> costs",&local_128e);
  std::__cxx11::string::_M_assign((string *)(local_1278 + 0x20));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c8,(typed_option<unsigned_int> *)&__msg);
  poVar3 = VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_ea0,"simulation",&local_128f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&loss_function_type,&local_ea0,&simulation);
  std::__cxx11::string::string
            (local_ec0,"cost-sensitive active learning simulation mode",&local_1290);
  std::__cxx11::string::_M_assign(local_d18);
  VW::config::typed_option<bool>::typed_option(&local_168,(typed_option<bool> *)&loss_function_type)
  ;
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_168);
  std::__cxx11::string::string((string *)&local_ee0,"baseline",&local_1291);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_ca8,&local_ee0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->is_baseline);
  std::__cxx11::string::string(local_f00,"cost-sensitive active learning baseline",&local_1292);
  std::__cxx11::string::_M_assign((string *)(local_ca8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_208,(typed_option<bool> *)local_ca8);
  poVar3 = VW::config::option_group_definition::add<bool>(poVar3,&local_208);
  std::__cxx11::string::string((string *)&local_f20,"domination",&local_1293);
  VW::config::typed_option<int>::typed_option(&local_348,&local_f20,&domination);
  ptVar4 = VW::config::typed_option<int>::default_value(&local_348,1);
  std::__cxx11::string::string
            (local_f40,"cost-sensitive active learning use domination. Default 1",&local_1294);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_2a8,ptVar4);
  poVar3 = VW::config::option_group_definition::add<int>(poVar3,&local_2a8);
  std::__cxx11::string::string((string *)&local_f60,"mellowness",&local_1295);
  VW::config::typed_option<float>::typed_option
            (&local_488,&local_f60,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->c0);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_488,0.1);
  std::__cxx11::string::string(local_f80,"mellowness parameter c_0. Default 0.1.",&local_1296);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3e8,ptVar5);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_3e8);
  std::__cxx11::string::string((string *)&local_fa0,"range_c",&local_1297);
  VW::config::typed_option<float>::typed_option
            (&local_5c8,&local_fa0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->c1);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_5c8,0.5);
  std::__cxx11::string::string
            (local_fc0,
             "parameter controlling the threshold for per-label cost uncertainty. Default 0.5.",
             &local_1298);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_528,ptVar5);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_528);
  std::__cxx11::string::string((string *)&local_fe0,"max_labels",&local_1299);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_708,&local_fe0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->max_labels);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_708,0xffffffffffffffff);
  std::__cxx11::string::string(local_1000,"maximum number of label queries.",&local_129a);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_668,ptVar6);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_668);
  std::__cxx11::string::string((string *)&local_1020,"min_labels",&local_129b);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_848,&local_1020,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->min_labels);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_848,0xffffffffffffffff);
  std::__cxx11::string::string(local_1040,"minimum number of label queries.",&local_129c);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_7a8,ptVar6);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_7a8);
  std::__cxx11::string::string((string *)&local_1060,"cost_max",&local_129d);
  VW::config::typed_option<float>::typed_option
            (&local_988,&local_1060,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_max);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_988,1.0);
  std::__cxx11::string::string(local_1080,"cost upper bound. Default 1.",&local_129e);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_8e8,ptVar5);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_8e8);
  std::__cxx11::string::string((string *)&local_10a0,"cost_min",&local_129f);
  VW::config::typed_option<float>::typed_option
            (&local_ac8,&local_10a0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_min);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_ac8,0.0);
  std::__cxx11::string::string(local_10c0,"cost lower bound. Default 0.",&local_12a0);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_a28,ptVar5);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_a28);
  std::__cxx11::string::string((string *)&local_10e0,"csa_debug",&local_12a1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_c08,&local_10e0,
             &(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->print_debug_stuff);
  std::__cxx11::string::string(local_1100,"print debug stuff for cs_active",&local_12a2);
  std::__cxx11::string::_M_assign((string *)(local_c08 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_b68,(typed_option<bool> *)local_c08);
  VW::config::option_group_definition::add<bool>(poVar3,&local_b68);
  VW::config::typed_option<bool>::~typed_option(&local_b68);
  std::__cxx11::string::~string(local_1100);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_c08);
  std::__cxx11::string::~string((string *)&local_10e0);
  VW::config::typed_option<float>::~typed_option(&local_a28);
  std::__cxx11::string::~string(local_10c0);
  VW::config::typed_option<float>::~typed_option(&local_ac8);
  std::__cxx11::string::~string((string *)&local_10a0);
  VW::config::typed_option<float>::~typed_option(&local_8e8);
  std::__cxx11::string::~string(local_1080);
  VW::config::typed_option<float>::~typed_option(&local_988);
  std::__cxx11::string::~string((string *)&local_1060);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_7a8);
  std::__cxx11::string::~string(local_1040);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_848);
  std::__cxx11::string::~string((string *)&local_1020);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_668);
  std::__cxx11::string::~string(local_1000);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_708);
  std::__cxx11::string::~string((string *)&local_fe0);
  VW::config::typed_option<float>::~typed_option(&local_528);
  std::__cxx11::string::~string(local_fc0);
  VW::config::typed_option<float>::~typed_option(&local_5c8);
  std::__cxx11::string::~string((string *)&local_fa0);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_f80);
  VW::config::typed_option<float>::~typed_option(&local_488);
  std::__cxx11::string::~string((string *)&local_f60);
  VW::config::typed_option<int>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_f40);
  VW::config::typed_option<int>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_f20);
  VW::config::typed_option<bool>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_f00);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_ca8);
  std::__cxx11::string::~string((string *)&local_ee0);
  VW::config::typed_option<bool>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_ec0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&loss_function_type);
  std::__cxx11::string::~string((string *)&local_ea0);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_e80);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_e60);
  (**options->_vptr_options_i)(options,&new_options);
  (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>.
  _M_head_impl)->use_domination = true;
  std::__cxx11::string::string((string *)&__msg,"domination",(allocator *)&loss_function_type);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if (((byte)iVar2 & domination == 0) == 1) {
    (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>
    ._M_head_impl)->use_domination = false;
  }
  std::__cxx11::string::string((string *)&__msg,"cs_active",(allocator *)&loss_function_type);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 == '\0') {
    plVar9 = (learner<cs_active,_example> *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>
    ._M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>
    ._M_head_impl)->t = 1;
    (**all->loss->_vptr_loss_function)(&loss_function_type);
    bVar1 = std::operator!=(&loss_function_type,"squared");
    if (bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1278,"error: you can\'t use non-squared loss with cs_active")
      ;
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x158,&local_da0);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"lda",(allocator *)local_ca8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1278,"error: you can\'t combine lda and active learning");
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15b,&local_dc0);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"active",(allocator *)local_ca8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1278,
                      "error: you can\'t use --cs_active and --active at the same time");
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15e,&local_de0);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"active_cover",(allocator *)local_ca8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1278,
                      "error: you can\'t use --cs_active and --active_cover at the same time");
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x161,&local_e00);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"csoaa",(allocator *)local_ca8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1278,
                      "error: you can\'t use --cs_active and --csoaa at the same time");
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x164,&local_e20);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::__cxx11::string::string((string *)&__msg,"adax",(allocator *)local_ca8);
    iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar2 == '\0') {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,
                               "WARNING: --cs_active should be used with --adax");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    ppuVar13 = &COST_SENSITIVE::cs_label;
    plVar14 = &all->p->lp;
    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
      plVar14->default_label = (_func_void_void_ptr *)*ppuVar13;
      ppuVar13 = ppuVar13 + (ulong)bVar15 * -2 + 1;
      plVar14 = (label_parser *)((long)plVar14 + (ulong)bVar15 * -0x10 + 8);
    }
    (*all->set_minmax)(all->sd,(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_max);
    (*all->set_minmax)(all->sd,(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->cost_min);
    for (uVar12 = 0;
        uVar12 < (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->num_classes + 1;
        uVar12 = uVar12 + 1) {
      ___msg = (_func_int **)0x0;
      v_array<unsigned_long>::push_back
                (&(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                   super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                   super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->examples_by_queries,
                 (unsigned_long *)&__msg);
    }
    if (simulation == false) {
      pbVar8 = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(pbVar8);
      predict = predict_or_learn<false,false>;
      learn = predict_or_learn<true,false>;
    }
    else {
      pbVar8 = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(pbVar8);
      predict = predict_or_learn<false,true>;
      learn = predict_or_learn<true,true>;
    }
    plVar9 = LEARNER::learner<cs_active,example>::init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_cs_active_*,_false>._M_head_impl,base,learn,predict,
                        (ulong)(data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_cs_active_*,_false>._M_head_impl)->num_classes
                        ,multilabels);
    data._M_t.super___uniq_ptr_impl<cs_active,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_cs_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_cs_active_*,_false>.
    _M_head_impl = (cs_active *)0x0;
    *(undefined8 *)(plVar9 + 0x58) = *(undefined8 *)(plVar9 + 0x18);
    *(code **)(plVar9 + 0x68) = finish_example;
    *(undefined8 *)(plVar9 + 0xb8) = *(undefined8 *)(plVar9 + 0x18);
    *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
    *(code **)(plVar9 + 200) = finish;
    all->cost_sensitive = (base_learner *)plVar9;
    std::__cxx11::string::~string((string *)&loss_function_type);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<cs_active,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar9;
}

Assistant:

base_learner* cs_active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cs_active>();

  bool simulation = false;
  int domination;
  option_group_definition new_options("Cost-sensitive Active Learning");
  new_options
      .add(make_option("cs_active", data->num_classes).keep().help("Cost-sensitive active learning with <k> costs"))
      .add(make_option("simulation", simulation).help("cost-sensitive active learning simulation mode"))
      .add(make_option("baseline", data->is_baseline).help("cost-sensitive active learning baseline"))
      .add(make_option("domination", domination)
               .default_value(1)
               .help("cost-sensitive active learning use domination. Default 1"))
      .add(make_option("mellowness", data->c0).default_value(0.1f).help("mellowness parameter c_0. Default 0.1."))
      .add(make_option("range_c", data->c1)
               .default_value(0.5f)
               .help("parameter controlling the threshold for per-label cost uncertainty. Default 0.5."))
      .add(make_option("max_labels", data->max_labels).default_value(-1).help("maximum number of label queries."))
      .add(make_option("min_labels", data->min_labels).default_value(-1).help("minimum number of label queries."))
      .add(make_option("cost_max", data->cost_max).default_value(1.f).help("cost upper bound. Default 1."))
      .add(make_option("cost_min", data->cost_min).default_value(0.f).help("cost lower bound. Default 0."))
      // TODO replace with trace and quiet
      .add(make_option("csa_debug", data->print_debug_stuff).help("print debug stuff for cs_active"));
  options.add_and_parse(new_options);

  data->use_domination = true;
  if (options.was_supplied("domination") && !domination)
    data->use_domination = false;

  if (!options.was_supplied("cs_active"))
    return nullptr;

  data->all = &all;
  data->t = 1;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "squared")
    THROW("error: you can't use non-squared loss with cs_active");

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --cs_active and --active at the same time");

  if (options.was_supplied("active_cover"))
    THROW("error: you can't use --cs_active and --active_cover at the same time");

  if (options.was_supplied("csoaa"))
    THROW("error: you can't use --cs_active and --csoaa at the same time");

  if (!options.was_supplied("adax"))
    all.trace_message << "WARNING: --cs_active should be used with --adax" << endl;

  all.p->lp = cs_label;  // assigning the label parser
  all.set_minmax(all.sd, data->cost_max);
  all.set_minmax(all.sd, data->cost_min);
  for (uint32_t i = 0; i < data->num_classes + 1; i++) data->examples_by_queries.push_back(0);

  learner<cs_active, example>& l = simulation
      ? init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>,
            predict_or_learn<false, true>, data->num_classes, prediction_type::multilabels)
      : init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, false>,
            predict_or_learn<false, false>, data->num_classes, prediction_type::multilabels);

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  base_learner* b = make_base(l);
  all.cost_sensitive = b;
  return b;
}